

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_stop(cubeb_stream_conflict *stm)

{
  long *in_RDI;
  
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  *(undefined4 *)(in_RDI + 10) = 1;
  while (in_RDI[6] != 0) {
    (*cubeb_pa_threaded_mainloop_wait)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  }
  (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  stream_cork(stm,(cork_state)((ulong)in_RDI >> 0x20));
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Cubeb stream (%p) stopped successfully.\n","cubeb_pulse.c",0x435,in_RDI);
  }
  return 0;
}

Assistant:

static int
pulse_stream_stop(cubeb_stream * stm)
{
  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  stm->shutdown = 1;
  // If draining is taking place wait to finish
  while (stm->drain_timer) {
    WRAP(pa_threaded_mainloop_wait)(stm->context->mainloop);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  stream_cork(stm, CORK | NOTIFY);
  LOG("Cubeb stream (%p) stopped successfully.", stm);
  return CUBEB_OK;
}